

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O0

void __thiscall Electron::Tape::Tape(Tape *this)

{
  Tape *this_local;
  
  Storage::Tape::TapePlayer::TapePlayer(&this->super_TapePlayer,2000000);
  Storage::Tape::Acorn::Shifter::Delegate::Delegate(&this->super_Delegate);
  (this->super_TapePlayer).super_TimedEventLoop._vptr_TimedEventLoop =
       (_func_int **)&PTR_process_next_event_00c9ff70;
  (this->super_TapePlayer).super_Source._vptr_Source = (_func_int **)&DAT_00c9ffb8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00c9ffd0;
  {unnamed_type#1}::Tape((_unnamed_type_1_ *)&this->input_);
  {unnamed_type#2}::Tape((_unnamed_type_2_ *)&this->output_);
  this->is_running_ = false;
  this->is_enabled_ = false;
  this->is_in_input_mode_ = false;
  this->data_register_ = 0;
  this->interrupt_status_ = '\0';
  this->last_posted_interrupt_status_ = '\0';
  this->delegate_ = (Delegate *)0x0;
  Storage::Tape::Acorn::Shifter::Shifter(&this->shifter_);
  Storage::Tape::Acorn::Shifter::set_delegate(&this->shifter_,&this->super_Delegate);
  return;
}

Assistant:

Tape::Tape() : TapePlayer(2000000) {
	shifter_.set_delegate(this);
}